

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception_format_value.cpp
# Opt level: O3

ExceptionFormatValue *
duckdb::ExceptionFormatValue::CreateFormatValue<duckdb::PhysicalType>
          (ExceptionFormatValue *__return_storage_ptr__,PhysicalType value)

{
  PhysicalType in_DL;
  undefined7 in_register_00000031;
  string local_30;
  
  TypeIdToString_abi_cxx11_(&local_30,(duckdb *)CONCAT71(in_register_00000031,value),in_DL);
  ExceptionFormatValue(__return_storage_ptr__,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

ExceptionFormatValue ExceptionFormatValue::CreateFormatValue(PhysicalType value) {
	return ExceptionFormatValue(TypeIdToString(value));
}